

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall
Graph::createCapacitorType(Graph *this,int id,double reactive_power,double cost_per_KVAr,int step)

{
  ostream *poVar1;
  Capacitor local_70;
  __normal_iterator<Capacitor_*,_std::vector<Capacitor,_std::allocator<Capacitor>_>_> local_48;
  const_iterator local_40;
  double local_38;
  double cost;
  double dStack_28;
  int step_local;
  double cost_per_KVAr_local;
  double reactive_power_local;
  Graph *pGStack_10;
  int id_local;
  Graph *this_local;
  
  cost._4_4_ = step;
  dStack_28 = cost_per_KVAr;
  cost_per_KVAr_local = reactive_power;
  reactive_power_local._4_4_ = id;
  pGStack_10 = this;
  poVar1 = std::operator<<((ostream *)&std::cout,"Capacitor Created with pot: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,cost_per_KVAr_local / (this->PB * 1000.0));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_38 = dStack_28 * cost_per_KVAr_local;
  local_48._M_current =
       (Capacitor *)std::vector<Capacitor,_std::allocator<Capacitor>_>::begin(&this->capacitorType);
  __gnu_cxx::__normal_iterator<Capacitor_const*,std::vector<Capacitor,std::allocator<Capacitor>>>::
  __normal_iterator<Capacitor*>
            ((__normal_iterator<Capacitor_const*,std::vector<Capacitor,std::allocator<Capacitor>>> *
             )&local_40,&local_48);
  Capacitor::Capacitor
            (&local_70,reactive_power_local._4_4_,cost_per_KVAr_local / (this->PB * 1000.0),local_38
             ,0);
  std::vector<Capacitor,_std::allocator<Capacitor>_>::insert
            (&this->capacitorType,local_40,&local_70);
  Capacitor::~Capacitor(&local_70);
  return;
}

Assistant:

void Graph::createCapacitorType(int id, double reactive_power, double cost_per_KVAr, int step){
    cout << "Capacitor Created with pot: " << reactive_power/(PB*1000) << endl;
    double cost = cost_per_KVAr * reactive_power;
    this->capacitorType.insert( this->capacitorType.begin(), Capacitor( id, reactive_power/(PB*1000), cost ) );
}